

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_neigh_cleanup(oonf_layer2_neigh *l2neigh,oonf_layer2_origin *origin)

{
  int local_28;
  _Bool local_21;
  int i;
  _Bool changed;
  oonf_layer2_origin *origin_local;
  oonf_layer2_neigh *l2neigh_local;
  
  local_21 = false;
  for (local_28 = 0; local_28 < 0x1a; local_28 = local_28 + 1) {
    if (l2neigh->data[local_28]._origin == origin) {
      l2neigh->data[local_28]._meta = (oonf_layer2_metadata *)0x0;
      l2neigh->data[local_28]._origin = (oonf_layer2_origin *)0x0;
      local_21 = true;
    }
  }
  return local_21;
}

Assistant:

bool
oonf_layer2_neigh_cleanup(struct oonf_layer2_neigh *l2neigh, const struct oonf_layer2_origin *origin) {
  bool changed = false;
  int i;

  for (i = 0; i < OONF_LAYER2_NEIGH_COUNT; i++) {
    if (l2neigh->data[i]._origin == origin) {
      oonf_layer2_data_reset(&l2neigh->data[i]);
      changed = true;
    }
  }
  return changed;
}